

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O2

int ncnn::binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_pow>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  undefined1 (*pauVar1) [16];
  uint uVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  float *pfVar9;
  long lVar10;
  float *pfVar11;
  int iVar12;
  float *pfVar13;
  float fVar14;
  undefined1 auVar15 [32];
  __m512 afVar16;
  undefined1 auVar18 [56];
  undefined1 auVar17 [64];
  __m128 afVar19;
  binary_op_pow op;
  __m512 _p1;
  __m512 _p;
  binary_op_pow local_165;
  int local_164;
  undefined8 local_160;
  Mat *local_158;
  ulong local_150;
  Mat *local_148;
  Mat *local_140;
  long local_138;
  long local_130;
  long local_128;
  void *local_120;
  void *local_118;
  void *local_110;
  ulong local_108;
  __m512 local_100;
  float local_c0 [2];
  float afStack_b8 [2];
  float afStack_b0 [2];
  float afStack_a8 [2];
  float afStack_a0 [2];
  float afStack_98 [2];
  float afStack_90 [2];
  float afStack_88 [22];
  
  uVar2 = a->c;
  local_164 = a->h * a->w * a->d * a->elempack;
  local_148 = a;
  local_140 = b;
  Mat::create_like(c,a,opt->blob_allocator);
  local_160 = 0xffffffffffffff9c;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    local_160 = 0;
    if ((int)uVar2 < 1) {
      uVar2 = 0;
    }
    local_150 = (ulong)uVar2;
    local_158 = c;
    for (local_108 = 0; local_108 != local_150; local_108 = local_108 + 1) {
      pvVar3 = local_148->data;
      pvVar4 = local_140->data;
      pvVar5 = c->data;
      lVar8 = local_148->elemsize * local_148->cstep * local_108;
      lVar7 = local_140->elemsize * local_140->cstep * local_108;
      lVar6 = c->elemsize * c->cstep * local_108;
      lVar10 = 0;
      local_138 = lVar8;
      local_130 = lVar7;
      local_128 = lVar6;
      local_120 = pvVar5;
      local_118 = pvVar4;
      local_110 = pvVar3;
      for (iVar12 = 0; iVar12 + 0xf < local_164; iVar12 = iVar12 + 0x10) {
        pfVar9 = (float *)((long)pvVar3 + lVar10 + lVar8);
        local_c0 = *(float (*) [2])pfVar9;
        afStack_b8 = *(float (*) [2])(pfVar9 + 2);
        afStack_b0 = *(float (*) [2])(pfVar9 + 4);
        afStack_a8 = *(float (*) [2])(pfVar9 + 6);
        afStack_a0 = *(float (*) [2])(pfVar9 + 8);
        afStack_98 = *(float (*) [2])(pfVar9 + 10);
        afStack_90 = *(float (*) [2])(pfVar9 + 0xc);
        afStack_88._0_8_ = *(undefined8 *)(pfVar9 + 0xe);
        afVar16 = *(__m512 *)((long)pvVar4 + lVar10 + lVar7);
        local_100 = afVar16;
        BinaryOp_x86_avx512_functor::binary_op_pow::func_pack16
                  (&local_165,(__m512 *)local_c0,&local_100);
        *(__m512 *)((long)pvVar5 + lVar10 + lVar6) = afVar16;
        lVar10 = lVar10 + 0x40;
      }
      for (; iVar12 + 7 < local_164; iVar12 = iVar12 + 8) {
        pfVar9 = (float *)((long)pvVar3 + lVar10 + lVar8);
        local_c0 = *(float (*) [2])pfVar9;
        afStack_b8 = *(float (*) [2])(pfVar9 + 2);
        afStack_b0 = *(float (*) [2])(pfVar9 + 4);
        afStack_a8 = *(float (*) [2])(pfVar9 + 6);
        auVar15 = *(undefined1 (*) [32])((long)pvVar4 + lVar10 + lVar7);
        local_100[0] = (float)auVar15._0_4_;
        local_100[1] = (float)auVar15._4_4_;
        local_100[2] = (float)auVar15._8_4_;
        local_100[3] = (float)auVar15._12_4_;
        local_100[4] = (float)auVar15._16_4_;
        local_100[5] = (float)auVar15._20_4_;
        local_100[6] = (float)auVar15._24_4_;
        local_100[7] = (float)auVar15._28_4_;
        BinaryOp_x86_avx512_functor::binary_op_pow::func_pack8
                  (&local_165,(__m256 *)local_c0,(__m256 *)local_100);
        *(undefined1 (*) [32])((long)pvVar5 + lVar10 + lVar6) = auVar15;
        lVar10 = lVar10 + 0x20;
      }
      for (; c = local_158, iVar12 + 3 < local_164; iVar12 = iVar12 + 4) {
        pfVar9 = (float *)((long)pvVar3 + lVar10 + lVar8);
        local_c0 = *(float (*) [2])pfVar9;
        afStack_b8 = *(float (*) [2])(pfVar9 + 2);
        pauVar1 = (undefined1 (*) [16])((long)pvVar4 + lVar10 + lVar7);
        local_100._0_16_ = *pauVar1;
        auVar18 = ZEXT856(*(ulong *)(*pauVar1 + 8));
        afVar19 = BinaryOp_x86_avx512_functor::binary_op_pow::func_pack4
                            (&local_165,(__m128 *)local_c0,(__m128 *)local_100);
        auVar17._0_8_ = afVar19._0_8_;
        auVar17._8_56_ = auVar18;
        *(undefined1 (*) [16])((long)pvVar5 + lVar10 + lVar6) = auVar17._0_16_;
        lVar10 = lVar10 + 0x10;
      }
      pfVar13 = (float *)((long)local_110 + local_138 + lVar10);
      pfVar9 = (float *)((long)local_118 + local_130 + lVar10);
      pfVar11 = (float *)((long)local_120 + local_128 + lVar10);
      for (; iVar12 < local_164; iVar12 = iVar12 + 1) {
        fVar14 = powf(*pfVar13,*pfVar9);
        *pfVar11 = fVar14;
        pfVar13 = pfVar13 + 1;
        pfVar9 = pfVar9 + 1;
        pfVar11 = pfVar11 + 1;
      }
    }
  }
  return (int)local_160;
}

Assistant:

static int binary_op_7_13_19_29(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 7 13 19 29
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}